

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void btreeReleaseAllCursorPages(BtCursor *pCur)

{
  int i;
  long lVar1;
  
  for (lVar1 = 0; lVar1 <= pCur->iPage; lVar1 = lVar1 + 1) {
    releasePage(pCur->apPage[lVar1]);
    pCur->apPage[lVar1] = (MemPage *)0x0;
  }
  pCur->iPage = -1;
  return;
}

Assistant:

static void btreeReleaseAllCursorPages(BtCursor *pCur){
  int i;
  for(i=0; i<=pCur->iPage; i++){
    releasePage(pCur->apPage[i]);
    pCur->apPage[i] = 0;
  }
  pCur->iPage = -1;
}